

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_helper.cpp
# Opt level: O0

vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
* Test_Helper::uniformImages
            (vector<unsigned_char,_std::allocator<unsigned_char>_> *intensityValue,Image *reference)

{
  uint32_t uVar1;
  size_type sVar2;
  char *message;
  size_type sVar3;
  reference pvVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  ImageTemplate<unsigned_char> *in_RDI;
  size_t i;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *image;
  reference in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  Image *in_stack_ffffffffffffff58;
  uchar value;
  undefined4 in_stack_ffffffffffffff60;
  uint32_t height;
  undefined8 in_stack_ffffffffffffff68;
  ImageTemplate<unsigned_char> *this;
  size_type local_58;
  
  this = in_RDI;
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RSI);
  if (sVar2 != 0) {
    std::
    vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
    ::vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
              *)0x16c9df);
    height = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_RSI,0);
    uniformImage((uint8_t)((ulong)in_stack_ffffffffffffff68 >> 0x38),
                 (uint32_t)in_stack_ffffffffffffff68,height,in_stack_ffffffffffffff58);
    std::
    vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
    ::push_back((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                 *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                in_stack_ffffffffffffff38);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x16ca2c);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RSI);
    std::
    vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
    ::resize((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
              *)CONCAT44(height,in_stack_ffffffffffffff60),(size_type)in_stack_ffffffffffffff58);
    local_58 = 1;
    while (sVar2 = local_58,
          sVar3 = std::
                  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                  ::size((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                          *)in_RDI), sVar2 < sVar3) {
      pvVar4 = std::
               vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
               ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                             *)in_RDI,0);
      value = (uchar)(sVar2 >> 0x38);
      PenguinV_Image::ImageTemplate<unsigned_char>::width(pvVar4);
      pvVar4 = std::
               vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
               ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                             *)in_RDI,0);
      uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::height(pvVar4);
      PenguinV_Image::ImageTemplate<unsigned_char>::generate
                (this,(uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI,
                 (uint8_t)((ulong)in_stack_ffffffffffffff68 >> 0x38),
                 (uint8_t)((ulong)in_stack_ffffffffffffff68 >> 0x30));
      std::
      vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
      ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                    *)in_RDI,local_58);
      PenguinV_Image::ImageTemplate<unsigned_char>::operator=
                ((ImageTemplate<unsigned_char> *)CONCAT44(uVar1,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff38);
      PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
                ((ImageTemplate<unsigned_char> *)0x16cb05);
      in_stack_ffffffffffffff38 =
           std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                         *)in_RDI,local_58);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_RSI,local_58);
      PenguinV_Image::ImageTemplate<unsigned_char>::fill
                ((ImageTemplate<unsigned_char> *)CONCAT44(height,in_stack_ffffffffffffff60),value);
      local_58 = local_58 + 1;
    }
    return (vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
            *)this;
  }
  message = (char *)__cxa_allocate_exception(0x28);
  imageException::imageException((imageException *)in_RDI,message);
  __cxa_throw(message,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

std::vector < PenguinV_Image::Image > uniformImages( const std::vector<uint8_t> & intensityValue, const PenguinV_Image::Image & reference )
    {
        if( intensityValue.size() == 0 )
            throw imageException( "Invalid parameter" );

        std::vector < PenguinV_Image::Image > image;

        image.push_back( uniformImage( intensityValue[0], 0, 0, reference ) );

        image.resize( intensityValue.size() );

        for( size_t i = 1u; i < image.size(); ++i ) {
            image[i] = reference.generate( image[0].width(), image[0].height() );
            image[i].fill( intensityValue[i] );
        }

        return image;
    }